

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::semicolon(Forth *this)

{
  Cell *pCVar1;
  CAddr CVar2;
  pointer pDVar3;
  uint uVar4;
  Cell i;
  int iVar5;
  
  data(this,3);
  data(this,4);
  uVar4 = this->False;
  CVar2 = this->VarOffsetState;
  iVar5 = 0;
  do {
    dataSpaceSet(this,CVar2 + iVar5,(Char)uVar4);
    uVar4 = uVar4 >> 8;
    iVar5 = iVar5 + 1;
  } while (iVar5 != 4);
  pDVar3 = (this->definitions).
           super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pCVar1 = &pDVar3[-1].flags;
  *pCVar1 = *pCVar1 ^ pDVar3[-1].FlagHidden;
  std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>::
  _M_erase_at_end(&this->localVariables,
                  (this->localVariables).
                  super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void semicolon() {
			data(CELL(exitXt));
			data(CELL(endOfDefinitionXt));
			setIsCompiling( False );
			lastDefinition().toggleHidden(); // @bug lastDefinition can be not last if compilation created additional definitions
			/// 13.3.3.1 These temporary dictionary entries shall vanish at the end of the definition, 
			/// denoted by ; (semicolon), ;CODE, or DOES>. 
			localVariables.clear();
		}